

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O1

bool __thiscall Writer::isFunctionPrinted(Writer *this,Func *func)

{
  string *func_00;
  bool bVar1;
  int iVar2;
  
  func_00 = &func->name;
  bVar1 = isCFunc(func_00);
  if ((((!bVar1) && (iVar2 = std::__cxx11::string::compare((char *)func_00), iVar2 != 0)) &&
      (iVar2 = std::__cxx11::string::compare((char *)func_00), iVar2 != 0)) &&
     ((iVar2 = std::__cxx11::string::compare((char *)func_00), iVar2 != 0 &&
      (bVar1 = isCMath(func_00), !bVar1)))) {
    if (this->useIncludes == true) {
      bVar1 = isStdLibFunc(func_00);
      if ((((!bVar1) && (bVar1 = isStringFunc(func_00), !bVar1)) &&
          (bVar1 = isStdioFunc(func_00), !bVar1)) && (bVar1 = isPthreadFunc(func_00), !bVar1)) {
        return true;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)func_00);
      if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)func_00), iVar2 != 0)) &&
         (iVar2 = std::__cxx11::string::compare((char *)func_00), iVar2 != 0)) {
        return true;
      }
      if ((ulong)((long)(func->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(func->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) < 0x19) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Writer::isFunctionPrinted(const Func* func) const {
    if (isCFunc(func->name) || func->name == "va_start" || func->name == "va_end" || func->name == "va_copy" || isCMath(func->name)) {
        return false;
    }

    if (useIncludes) {
        if (isStdLibFunc(func->name) || isStringFunc(func->name) || isStdioFunc(func->name) || isPthreadFunc(func->name)) {
            return false;
        }
    } else {
        if ((func->name == "memcpy" || func->name == "memset" || func->name == "memmove") && func->parameters.size() > 3) {
            return false;
        }
    }

    return true;
}